

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O0

void __thiscall
nestl::impl::detail::
rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
::rb_tree(rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
          *this,rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
                *x)

{
  node_allocator *a;
  base_ptr *pprVar1;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
  *x_local;
  rb_tree<int,_int,_nestl::impl::detail::identity<int>,_std::less<int>,_nestl::test::allocator_with_state<int>_>
  *this_local;
  
  a = m_get_node_allocator(x);
  rb_tree_impl<std::less<int>_>::rb_tree_impl(&this->m_impl,(less<int> *)&(x->m_impl).field_0x10,a);
  pprVar1 = m_root(x);
  if (*pprVar1 != (base_ptr)0x0) {
    m_move_data(this,x);
  }
  return;
}

Assistant:

rb_tree(rb_tree&& x) NESTL_NOEXCEPT_SPEC
        : m_impl(x.m_impl.m_key_compare, x.m_get_node_allocator())
    {
        if (x.m_root() != 0)
        {
			m_move_data(x, std::true_type());
        }
    }